

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::EmitTTDVar(TTDVar var,FileWriter *writer,Separator separator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined7 in_register_00000011;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  if (var == (TTDVar)0x0) {
    (*writer->_vptr_FileWriter[3])(writer,0x14,0);
    (*writer->_vptr_FileWriter[0x14])(writer,1,0);
    FileWriter::WriteNull(writer,nullVal,CommaSeparator);
  }
  else {
    bVar2 = Js::VarIs<Js::RecyclableObject>(var);
    if (bVar2) {
      (*writer->_vptr_FileWriter[3])(writer,0x14,0);
      (*writer->_vptr_FileWriter[0x14])(writer,4,0);
      FileWriter::WriteAddr(writer,ptrIdVal,(TTD_PTR_ID)var,CommaSeparator);
      goto LAB_0093b2b5;
    }
    if (((ulong)var & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)var & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_0093b2d1;
      *puVar3 = 0;
    }
    if (((ulong)var & 0xffff000000000000) == 0x1000000000000) {
      (*writer->_vptr_FileWriter[3])(writer,0x14,0);
      (*writer->_vptr_FileWriter[0x14])(writer,2,0);
      if (((ulong)var & 0x1ffff00000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                           ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                           "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) {
LAB_0093b2d1:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      FileWriter::WriteInt32(writer,i32Val,(int32)var,CommaSeparator);
    }
    else {
      if ((ulong)var >> 0x32 == 0) {
        TTDAbort_unrecoverable_error("Only other tagged value we support!!!");
      }
      (*writer->_vptr_FileWriter[3])(writer,0x14,0);
      (*writer->_vptr_FileWriter[0x14])(writer,3,0);
      FileWriter::WriteDouble
                (writer,doubleVal,(double)((ulong)var ^ 0xfffc000000000000),CommaSeparator);
    }
  }
LAB_0093b2b5:
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitTTDVar(TTDVar var, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            if(var == nullptr)
            {
                writer->WriteTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag, TTDVarEmitTag::TTDVarNull);
                writer->WriteNull(NSTokens::Key::nullVal, NSTokens::Separator::CommaSeparator);
            }
            else if(Js::TaggedNumber::Is(var))
            {
#if FLOATVAR
                if(Js::TaggedInt::Is(var))
                {
#endif
                    writer->WriteTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag, TTDVarEmitTag::TTDVarInt);
                    writer->WriteInt32(NSTokens::Key::i32Val, Js::TaggedInt::ToInt32(var), NSTokens::Separator::CommaSeparator);
#if FLOATVAR
                }
                else
                {
                    TTDAssert(Js::JavascriptNumber::Is_NoTaggedIntCheck(var), "Only other tagged value we support!!!");

                    writer->WriteTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag, TTDVarEmitTag::TTDVarDouble);
                    writer->WriteDouble(NSTokens::Key::doubleVal, Js::JavascriptNumber::GetValue(var), NSTokens::Separator::CommaSeparator);
                }
#endif
            }
            else
            {
                writer->WriteTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag, TTDVarEmitTag::TTDVarAddr);
                writer->WriteAddr(NSTokens::Key::ptrIdVal, TTD_CONVERT_VAR_TO_PTR_ID(var), NSTokens::Separator::CommaSeparator);
            }

            writer->WriteRecordEnd();
        }